

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O0

uintwide_t<256U,_unsigned_short,_void,_false> * __thiscall
math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::operator+=
          (uintwide_t<256U,_unsigned_short,_void,_false> *this,
          uintwide_t<256U,_unsigned_short,_void,_false> *other)

{
  iterator puVar1;
  const_iterator puVar2;
  const_iterator puVar3;
  undefined1 auStack_38 [4];
  limb_type_conflict carry_1;
  limb_type_conflict carry;
  uintwide_t<256U,_unsigned_short,_void,_false> self;
  uintwide_t<256U,_unsigned_short,_void,_false> *other_local;
  uintwide_t<256U,_unsigned_short,_void,_false> *this_local;
  
  self.values.super_array<unsigned_short,_16UL>.elems._24_8_ = other;
  if (this == other) {
    _auStack_38 = *(undefined8 *)(other->values).super_array<unsigned_short,_16UL>.elems;
    self.values.super_array<unsigned_short,_16UL>.elems._0_8_ =
         *(undefined8 *)((other->values).super_array<unsigned_short,_16UL>.elems + 4);
    self.values.super_array<unsigned_short,_16UL>.elems._8_8_ =
         *(undefined8 *)((other->values).super_array<unsigned_short,_16UL>.elems + 8);
    self.values.super_array<unsigned_short,_16UL>.elems._16_8_ =
         *(undefined8 *)((other->values).super_array<unsigned_short,_16UL>.elems + 0xc);
    puVar1 = detail::array_detail::array<unsigned_short,_16UL>::begin
                       ((array<unsigned_short,_16UL> *)this);
    puVar2 = detail::array_detail::array<unsigned_short,_16UL>::cbegin
                       ((array<unsigned_short,_16UL> *)this);
    puVar3 = detail::array_detail::array<unsigned_short,_16UL>::cbegin
                       ((array<unsigned_short,_16UL> *)auStack_38);
    uintwide_t<256u,unsigned_short,void,false>::
    eval_add_n<unsigned_short*,unsigned_short_const*,unsigned_short_const*>
              (puVar1,puVar2,puVar3,0x10,0);
  }
  else {
    puVar1 = detail::array_detail::array<unsigned_short,_16UL>::begin
                       ((array<unsigned_short,_16UL> *)this);
    puVar2 = detail::array_detail::array<unsigned_short,_16UL>::cbegin
                       ((array<unsigned_short,_16UL> *)this);
    puVar3 = detail::array_detail::array<unsigned_short,_16UL>::cbegin
                       ((array<unsigned_short,_16UL> *)
                        self.values.super_array<unsigned_short,_16UL>.elems._24_8_);
    uintwide_t<256u,unsigned_short,void,false>::
    eval_add_n<unsigned_short*,unsigned_short_const*,unsigned_short_const*>
              (puVar1,puVar2,puVar3,0x10,0);
  }
  return this;
}

Assistant:

constexpr auto operator+=(const uintwide_t& other) -> uintwide_t&
    {
      if(this == &other)
      {
        const uintwide_t self(other); // NOLINT(performance-unnecessary-copy-initialization)

        // Unary addition function.
        const auto carry = eval_add_n(values.begin(), // LCOV_EXCL_LINE
                                      values.cbegin(),
                                      self.values.cbegin(),
                                      static_cast<unsigned_fast_type>(number_of_limbs),
                                      static_cast<limb_type>(UINT8_C(0)));

        static_cast<void>(carry);
      }
      else
      {
        // Unary addition function.
        const auto carry = eval_add_n(values.begin(),
                                      values.cbegin(),
                                      other.values.cbegin(),
                                      static_cast<unsigned_fast_type>(number_of_limbs),
                                      static_cast<limb_type>(UINT8_C(0)));

        static_cast<void>(carry);
      }

      return *this;
    }